

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-dt-erector.cpp
# Opt level: O0

PseudoDataLoc *
yactfr::internal::anon_unknown_2::pseudoDataLocOfDynDt
          (PseudoDataLoc *__return_storage_ptr__,JsonObjVal *jsonDt,string *propName)

{
  type this;
  bool bVar1;
  JsonVal *pJVar2;
  JsonArrayVal *this_00;
  pointer pJVar3;
  JsonStrVal *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  TextLocation *pTVar4;
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  type local_c0;
  reference local_b8;
  unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
  *jsonPathElem;
  const_iterator __end3;
  const_iterator __begin3;
  JsonArrayVal *__range3;
  allocator local_81;
  string local_80;
  JsonArrayVal *local_60;
  JsonArrayVal *jsonPathVal;
  PathElems pathElems;
  type local_38;
  type scope;
  JsonObjVal *jsonLocVal;
  string *propName_local;
  JsonObjVal *jsonDt_local;
  
  pJVar2 = JsonObjVal::operator[](jsonDt,propName);
  pathElems.
  super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)JsonVal::asObj(pJVar2);
  scope.super_type =
       (type)pathElems.
             super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38 = (type)call<yactfr::internal::(anonymous_namespace)::pseudoDataLocOfDynDt(yactfr::internal::JsonObjVal_const&,std::__cxx11::string_const&)::__0>
                             ((anon_class_8_1_ac29b887)
                              pathElems.
                              super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&jsonPathVal);
  this = scope;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"path",&local_81);
  pJVar2 = JsonObjVal::operator[]((JsonObjVal *)this.super_type,&local_80);
  this_00 = JsonVal::asArray(pJVar2);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_60 = this_00;
  __end3 = JsonArrayVal::begin(this_00);
  jsonPathElem = (unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                  *)JsonArrayVal::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_*,_std::vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
                                *)&jsonPathElem);
    if (!bVar1) break;
    local_b8 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_*,_std::vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
               ::operator*(&__end3);
    pJVar3 = std::
             unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
             ::operator->(local_b8);
    bVar1 = JsonVal::isNull(pJVar3);
    if (bVar1) {
      std::
      vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
      ::emplace_back<boost::none_t_const&>
                ((vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
                  *)&jsonPathVal,(none_t *)&boost::none);
    }
    else {
      pJVar3 = std::
               unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
               ::operator->(local_b8);
      this_01 = JsonVal::asStr_abi_cxx11_(pJVar3);
      __args = JsonScalarVal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(yactfr::internal::JsonValKind)5>
               ::operator*(this_01);
      std::
      vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string_const&>
                ((vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
                  *)&jsonPathVal,__args);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_*,_std::vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>_>
    ::operator++(&__end3);
  }
  bVar1 = boost::optional<yactfr::Scope>::operator!((optional<yactfr::Scope> *)&local_38);
  local_c0 = local_38;
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_d8,
           (vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&jsonPathVal);
  pTVar4 = JsonVal::loc((JsonVal *)scope.super_type);
  PseudoDataLoc::PseudoDataLoc
            (__return_storage_ptr__,bVar1 + 1 + (uint)bVar1,(optional<yactfr::Scope>)local_c0,
             &local_d8,*pTVar4);
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_d8);
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&jsonPathVal);
  return __return_storage_ptr__;
}

Assistant:

PseudoDataLoc pseudoDataLocOfDynDt(const JsonObjVal& jsonDt, const std::string& propName)
{
    auto& jsonLocVal = jsonDt[propName]->asObj();

    const auto scope = call([&jsonLocVal]() -> boost::optional<Scope> {
        if (const auto jsonOrigVal = jsonLocVal[strs::orig]) {
            // absolute
            return call([jsonOrigVal] {
                auto& scopeName = *jsonOrigVal->asStr();

                if (scopeName == strs::pktHeader) {
                    return Scope::PacketHeader;
                } else if (scopeName == strs::pktCtx) {
                    return Scope::PacketContext;
                } else if (scopeName == strs::erHeader) {
                    return Scope::EventRecordHeader;
                } else if (scopeName == strs::erCommonCtx) {
                    return Scope::EventRecordCommonContext;
                } else if (scopeName == strs::erSpecCtx) {
                    return Scope::EventRecordSpecificContext;
                } else {
                    assert(scopeName == strs::erPayload);
                    return Scope::EventRecordPayload;
                }
            });
        }

        // relative
        return boost::none;
    });

    PseudoDataLoc::PathElems pathElems;

    {
        auto& jsonPathVal = jsonLocVal[strs::path]->asArray();

        for (auto& jsonPathElem : jsonPathVal) {
            if (jsonPathElem->isNull()) {
                pathElems.emplace_back(boost::none);
            } else {
                pathElems.emplace_back(*jsonPathElem->asStr());
            }
        }
    }

    return PseudoDataLoc {
        scope ? PseudoDataLoc::Kind::Abs : PseudoDataLoc::Kind::Rel2,
        scope, std::move(pathElems), jsonLocVal.loc()
    };
}